

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

void __thiscall
Sudoku::chooseOpenFieldInTestFieldsAndFixToSolution
          (Sudoku *this,FieldVector *testFields,int chooseFieldThatHasNPossibilities,
          bool fixFieldChooseRandomly,bool debug)

{
  int iVar1;
  size_type sVar2;
  __shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  ostream *poVar5;
  __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
  local_48;
  int local_3c;
  __shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_38;
  int correctValue;
  shared_ptr<Field> *testField;
  int nTestFields;
  int index;
  int posYtoFix;
  int posXtoFix;
  bool debug_local;
  bool fixFieldChooseRandomly_local;
  FieldVector *pFStack_18;
  int chooseFieldThatHasNPossibilities_local;
  FieldVector *testFields_local;
  Sudoku *this_local;
  
  index = 0;
  nTestFields = 0;
  testField._4_4_ = 0;
  posYtoFix._2_1_ = debug;
  posYtoFix._3_1_ = fixFieldChooseRandomly;
  posXtoFix = chooseFieldThatHasNPossibilities;
  pFStack_18 = testFields;
  testFields_local = (FieldVector *)this;
  sVar2 = std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::size
                    (testFields);
  testField._0_4_ = (int)sVar2;
  if ((posYtoFix._3_1_ & 1) == 0) {
    do {
      do {
        iVar1 = rand();
        testField._4_4_ = iVar1 % (int)testField;
        p_Stack_38 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                     operator[](pFStack_18,(long)testField._4_4_);
        peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Stack_38);
        iVar1 = Field::value(peVar4);
      } while (iVar1 != 0);
      peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Stack_38);
      iVar1 = Field::n_possible(peVar4);
    } while (iVar1 != posXtoFix);
    peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (p_Stack_38);
    index = Field::pos_x(peVar4);
    peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (p_Stack_38);
    nTestFields = Field::pos_y(peVar4);
  }
  else {
    do {
      iVar1 = rand();
      testField._4_4_ = iVar1 % (int)testField;
      p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
               operator[](pFStack_18,(long)testField._4_4_);
      peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var3);
      iVar1 = Field::value(peVar4);
    } while (iVar1 != 0);
    p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
             operator[](pFStack_18,(long)testField._4_4_);
    peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (p_Var3);
    index = Field::pos_x(peVar4);
    p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
             operator[](pFStack_18,(long)testField._4_4_);
    peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (p_Var3);
    nTestFields = Field::pos_y(peVar4);
  }
  local_48 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
             ::operator+(&this->field_begin_,(long)testField._4_4_);
  p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
           ::operator*(&local_48);
  peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var3);
  local_3c = Field::value(peVar4);
  p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::operator[]
                     (pFStack_18,(long)testField._4_4_);
  peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var3);
  Field::setValue(peVar4,local_3c);
  p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::operator[]
                     (pFStack_18,(long)testField._4_4_);
  peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var3);
  Field::setFixed(peVar4,true);
  if ((posYtoFix._2_1_ & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Fix field (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,index);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,nTestFields);
    poVar5 = std::operator<<(poVar5,") (index ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,testField._4_4_);
    poVar5 = std::operator<<(poVar5,") to value ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_3c);
    poVar5 = std::operator<<(poVar5,", fixFieldChooseRandomly=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)(posYtoFix._3_1_ & 1));
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Sudoku::chooseOpenFieldInTestFieldsAndFixToSolution(FieldVector &testFields, int chooseFieldThatHasNPossibilities, bool fixFieldChooseRandomly, bool debug)
{
  int posXtoFix = 0;
  int posYtoFix = 0;
  int index = 0;

  int nTestFields = testFields.size();

  // choose field coordinates (posXtoFix, posYtoFix) that gets fixed afterwards
  if(fixFieldChooseRandomly)
  {
    for(;;)
    {
      // choose a random field and check if it is not already set
      index = rand() % nTestFields;
      if(testFields[index]->value() == 0)
      {
        // store these coordinates
        posXtoFix = testFields[index]->pos_x();
        posYtoFix = testFields[index]->pos_y();

        //std::cout<<"r"<<testFields[index]->n_possible()<<" ";
        break;
      }
    }
  }
  else    // do not choose completely randomly
  {
    //take the first field that has the given number of posibilities
    //for(index = 0; index < testFields.size(); index++)

    //take a random field that has the given number of posibilities
    while(true)
    {
      index = rand() % nTestFields;
      std::shared_ptr<Field> &testField = testFields[index];

      if(testField->value() != 0)
        continue;

      if(testField->n_possible() == chooseFieldThatHasNPossibilities)
      {
        //std::cout<<"a"<<testFields[index]->n_possible()<<" ";
        posXtoFix = testField->pos_x();
        posYtoFix = testField->pos_y();
        break;
      }
    }
  }

  //int correctValue = fields_[index]->value();   // select correct value from solved sudoku
  int correctValue = (*(field_begin_+index))->value();   // select correct value from solved sudoku

  testFields[index]->setValue(correctValue);
  testFields[index]->setFixed(true);

  if(debug)
    std::cout<<"Fix field ("<<posXtoFix<<","<<posYtoFix<<") (index "<<index<<") to value "<<correctValue<<", fixFieldChooseRandomly="<<int(fixFieldChooseRandomly)<<std::endl;
}